

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O1

int ncnn::binary_op_7_13_19_29<ncnn::BinaryOp_x86_functor::binary_op_div>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  undefined1 auVar1 [16];
  uint uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ulong uVar6;
  float *pfVar7;
  uint uVar8;
  undefined1 (*pauVar9) [16];
  float *pfVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  undefined1 in_XMM2 [16];
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  uVar2 = a->c;
  uVar8 = a->h * a->w * a->d * a->elempack;
  Mat::create_like(c,a,opt->blob_allocator);
  iVar11 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    if (0 < (int)uVar2) {
      uVar6 = 0;
      do {
        pfVar7 = (float *)(a->cstep * uVar6 * a->elemsize + (long)a->data);
        pauVar9 = (undefined1 (*) [16])(b->cstep * uVar6 * b->elemsize + (long)b->data);
        pfVar10 = (float *)(c->cstep * uVar6 * c->elemsize + (long)c->data);
        if ((int)uVar8 < 4) {
          uVar12 = 0;
        }
        else {
          iVar11 = 3;
          do {
            fVar3 = pfVar7[1];
            fVar4 = pfVar7[2];
            fVar5 = pfVar7[3];
            auVar1 = *pauVar9;
            in_XMM2 = rcpps(in_XMM2,auVar1);
            fVar14 = *pfVar7 * in_XMM2._0_4_;
            fVar15 = fVar3 * in_XMM2._4_4_;
            fVar16 = fVar4 * in_XMM2._8_4_;
            fVar17 = fVar5 * in_XMM2._12_4_;
            *pfVar10 = (*pfVar7 - auVar1._0_4_ * fVar14) * in_XMM2._0_4_ + fVar14;
            pfVar10[1] = (fVar3 - auVar1._4_4_ * fVar15) * in_XMM2._4_4_ + fVar15;
            pfVar10[2] = (fVar4 - auVar1._8_4_ * fVar16) * in_XMM2._8_4_ + fVar16;
            pfVar10[3] = (fVar5 - auVar1._12_4_ * fVar17) * in_XMM2._12_4_ + fVar17;
            pfVar7 = pfVar7 + 4;
            pauVar9 = pauVar9 + 1;
            pfVar10 = pfVar10 + 4;
            iVar11 = iVar11 + 4;
            uVar12 = uVar8 & 0xfffffffc;
          } while (iVar11 < (int)uVar8);
        }
        if (uVar8 - uVar12 != 0 && (int)uVar12 <= (int)uVar8) {
          lVar13 = 0;
          do {
            pfVar10[lVar13] = pfVar7[lVar13] / *(float *)(*pauVar9 + lVar13 * 4);
            lVar13 = lVar13 + 1;
          } while (uVar8 - uVar12 != (int)lVar13);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar2);
    }
    iVar11 = 0;
  }
  return iVar11;
}

Assistant:

static int binary_op_7_13_19_29(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 7 13 19 29
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}